

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shm.c
# Opt level: O3

QcShm * qc_shm_create(char *name,size_t shmsize,QcErr *err)

{
  uint uVar1;
  int __fd;
  int iVar2;
  char *pcVar3;
  QcShm *__dest;
  uint *puVar4;
  char *__name;
  
  shm_unlink(name);
  __fd = shm_open(name,0xc2,0x180);
  if (__fd == -1) {
    puVar4 = (uint *)__errno_location();
    qc_seterr(err,-1,"create shm failed, name : %s errno=%d\n",name,(ulong)*puVar4);
  }
  else {
    iVar2 = ftruncate(__fd,shmsize);
    if (iVar2 == -1) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar3 = "ftruncate failed. errno=%d\n";
    }
    else {
      pcVar3 = (char *)mmap((void *)0x0,shmsize,3,1,__fd,0);
      if (pcVar3 != (char *)0xffffffffffffffff) {
        close(__fd);
        __name = (char *)0x1;
        __dest = (QcShm *)calloc(1,0x98);
        if (__dest != (QcShm *)0x0) {
          strncpy((char *)__dest,name,0x80);
          __dest->shmaddr = pcVar3;
          __dest->shmsize = shmsize;
          return __dest;
        }
        qc_shm_create_cold_1();
        munmap(*(void **)(__name + 0x88),*(size_t *)(__name + 0x90));
        shm_unlink(__name);
        return (QcShm *)0x0;
      }
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar3 = "mmap faied, errno=%d\n";
    }
    qc_seterr(err,-1,pcVar3,(ulong)uVar1);
  }
  return (QcShm *)0x0;
}

Assistant:

QcShm* qc_shm_create(const char *name, size_t shmsize, QcErr *err)
{
    int flags, opt, fd;
    mode_t perms;
    size_t size;
    char *addr;

    flags = O_CREAT|O_EXCL|O_RDWR;
    perms = S_IRUSR|S_IWUSR;

    //unlink shm first?
    shm_unlink(name);

    fd = shm_open(name, flags, perms);
    if(fd == -1)
    {
        qc_seterr(err, -1, "create shm failed, name : %s errno=%d\n", name, errno);
        return NULL;
    }

    if(ftruncate(fd, shmsize) == -1)
    {
        qc_seterr(err, -1, "ftruncate failed. errno=%d\n", errno);
        return NULL;
    }

    addr = mmap(NULL, shmsize, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if(addr == MAP_FAILED)
    {
        qc_seterr(err, -1, "mmap faied, errno=%d\n", errno);
        return NULL;
    }

    close(fd);

    QcShm *qcShm;
    qc_malloc(qcShm, sizeof(QcShm));
    strncpy(qcShm->name, name, QC_SHMNAME_MAXLEN);
    qcShm->shmaddr = addr;
    qcShm->shmsize = shmsize;

    return qcShm;
}